

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

CK_RV __thiscall Token::setUserPIN(Token *this,ByteString *oldPIN,ByteString *newPIN)

{
  long *plVar1;
  undefined3 uVar2;
  byte bVar3;
  bool bVar4;
  SecureDataManager *this_00;
  long in_RDI;
  ByteString userPINBlob;
  ByteString soPINBlob;
  SecureDataManager *newSdm;
  bool stayLoggedIn;
  MutexLocker lock;
  CK_ULONG flags;
  undefined5 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  byte bVar5;
  undefined1 in_stack_fffffffffffffe7f;
  SecureDataManager *in_stack_fffffffffffffe80;
  SecureDataManager *in_stack_fffffffffffffe88;
  SecureDataManager *in_stack_fffffffffffffea0;
  ByteString *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  undefined1 local_128 [40];
  undefined1 local_100 [40];
  undefined1 local_d8 [47];
  undefined1 local_a9;
  SecureDataManager *local_58;
  byte local_3d;
  undefined4 local_3c;
  undefined2 local_28;
  byte bStack_26;
  undefined5 uStack_25;
  CK_RV local_8;
  
  MutexLocker::MutexLocker
            ((MutexLocker *)in_stack_fffffffffffffe80,
             (Mutex *)CONCAT17(in_stack_fffffffffffffe7f,
                               CONCAT16(in_stack_fffffffffffffe7e,
                                        CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78
                                                ))));
  if (*(long *)(in_RDI + 0x18) == 0) {
    local_8 = 5;
    local_3c = 1;
  }
  else {
    local_3d = SecureDataManager::isUserLoggedIn(*(SecureDataManager **)(in_RDI + 0x18));
    bVar3 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))(*(long **)(in_RDI + 0x10),&local_28);
    if ((bVar3 & 1) == 0) {
      softHSMLog(3,"setUserPIN",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x137,"Could not get the token flags");
      local_8 = 5;
      local_3c = 1;
    }
    else {
      this_00 = (SecureDataManager *)operator_new(0xd0);
      local_a9 = 1;
      SecureDataManager::getSOPINBlob
                ((SecureDataManager *)
                 CONCAT17(in_stack_fffffffffffffe7f,
                          CONCAT16(in_stack_fffffffffffffe7e,
                                   CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78))));
      SecureDataManager::getUserPINBlob
                ((SecureDataManager *)
                 CONCAT17(in_stack_fffffffffffffe7f,
                          CONCAT16(in_stack_fffffffffffffe7e,
                                   CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78))));
      SecureDataManager::SecureDataManager
                (this_00,(ByteString *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)
                 ,in_stack_fffffffffffffeb0);
      local_a9 = 0;
      ByteString::~ByteString((ByteString *)0x1ede18);
      ByteString::~ByteString((ByteString *)0x1ede25);
      local_58 = this_00;
      bVar4 = SecureDataManager::loginUser
                        (in_stack_fffffffffffffe80,
                         (ByteString *)
                         CONCAT17(in_stack_fffffffffffffe7f,
                                  CONCAT16(in_stack_fffffffffffffe7e,
                                           CONCAT15(in_stack_fffffffffffffe7d,
                                                    in_stack_fffffffffffffe78))));
      if (bVar4) {
        bVar4 = SecureDataManager::setUserPIN
                          (in_stack_fffffffffffffe88,(ByteString *)in_stack_fffffffffffffe80);
        if (bVar4) {
          plVar1 = *(long **)(in_RDI + 0x10);
          SecureDataManager::getUserPINBlob
                    ((SecureDataManager *)
                     CONCAT17(in_stack_fffffffffffffe7f,
                              CONCAT16(in_stack_fffffffffffffe7e,
                                       CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78)
                                      )));
          bVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,local_d8);
          ByteString::~ByteString((ByteString *)0x1edff9);
          if ((bVar3 & 1) == 0) {
            if (local_58 != (SecureDataManager *)0x0) {
              (*local_58->_vptr_SecureDataManager[1])();
            }
            local_8 = 5;
            local_3c = 1;
          }
          else {
            if ((local_3d & 1) == 0) {
              SecureDataManager::logout(in_stack_fffffffffffffea0);
            }
            in_stack_fffffffffffffe80 = *(SecureDataManager **)(in_RDI + 0x18);
            if (in_stack_fffffffffffffe80 != (SecureDataManager *)0x0) {
              (*in_stack_fffffffffffffe80->_vptr_SecureDataManager[1])();
            }
            *(SecureDataManager **)(in_RDI + 0x18) = local_58;
            ByteString::ByteString((ByteString *)0x1ee0ba);
            ByteString::ByteString((ByteString *)0x1ee0c6);
            bVar3 = (**(code **)(**(long **)(in_RDI + 0x10) + 8))
                              (*(long **)(in_RDI + 0x10),local_100);
            bVar5 = 0;
            if ((bVar3 & 1) != 0) {
              bVar5 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x18))
                                (*(long **)(in_RDI + 0x10),local_128);
            }
            *(byte *)(in_RDI + 8) = bVar5 & 1;
            uVar2 = CONCAT12(bStack_26,local_28);
            bStack_26 = bStack_26 & 0xfe;
            (**(code **)(**(long **)(in_RDI + 0x10) + 0x28))
                      (*(long **)(in_RDI + 0x10),CONCAT53(uStack_25,uVar2) & 0xfffffffffffeffff);
            local_8 = 0;
            local_3c = 1;
            ByteString::~ByteString((ByteString *)0x1ee178);
            ByteString::~ByteString((ByteString *)0x1ee185);
          }
        }
        else {
          if (local_58 != (SecureDataManager *)0x0) {
            (*local_58->_vptr_SecureDataManager[1])();
          }
          local_8 = 5;
          local_3c = 1;
        }
      }
      else {
        uVar2 = CONCAT12(bStack_26,local_28);
        bStack_26 = bStack_26 | 1;
        (**(code **)(**(long **)(in_RDI + 0x10) + 0x28))
                  (*(long **)(in_RDI + 0x10),CONCAT53(uStack_25,uVar2) | 0x10000);
        if (local_58 != (SecureDataManager *)0x0) {
          (*local_58->_vptr_SecureDataManager[1])();
        }
        local_8 = 0xa0;
        local_3c = 1;
      }
    }
  }
  MutexLocker::~MutexLocker((MutexLocker *)in_stack_fffffffffffffe80);
  return local_8;
}

Assistant:

CK_RV Token::setUserPIN(ByteString& oldPIN, ByteString& newPIN)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// Check if user should stay logged in
	bool stayLoggedIn = sdm->isUserLoggedIn();

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Verify oldPIN
	SecureDataManager* newSdm = new SecureDataManager(sdm->getSOPINBlob(), sdm->getUserPINBlob());
	if (newSdm->loginUser(oldPIN) == false)
	{
		flags |= CKF_USER_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		delete newSdm;
		return CKR_PIN_INCORRECT;
	}

	// Set the new user PIN
	if (newSdm->setUserPIN(newPIN) == false)
	{
		delete newSdm;
		return CKR_GENERAL_ERROR;
	}

	// Save PIN to token file
	if (token->setUserPIN(newSdm->getUserPINBlob()) == false)
	{
		delete newSdm;
		return CKR_GENERAL_ERROR;
	}

	// Restore previous login state
	if (!stayLoggedIn) newSdm->logout();

	// Switch sdm
	delete sdm;
	sdm = newSdm;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	flags &= ~CKF_USER_PIN_COUNT_LOW;
	token->setTokenFlags(flags);

	return CKR_OK;
}